

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsLotkaVolterra_ASA.c
# Opt level: O0

int lotka_volterra(sunrealtype t,N_Vector uvec,N_Vector udotvec,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype *udot;
  sunrealtype *u;
  sunrealtype *p;
  
  pdVar1 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar2 = (double *)N_VGetArrayPointer(in_RSI);
  *pdVar2 = *in_RDX * *pdVar1 + -(in_RDX[1] * *pdVar1 * pdVar1[1]);
  pdVar2[1] = -in_RDX[2] * pdVar1[1] + in_RDX[3] * *pdVar1 * pdVar1[1];
  return 0;
}

Assistant:

int lotka_volterra(sunrealtype t, N_Vector uvec, N_Vector udotvec, void* user_data)
{
  sunrealtype* p    = (sunrealtype*)user_data;
  sunrealtype* u    = N_VGetArrayPointer(uvec);
  sunrealtype* udot = N_VGetArrayPointer(udotvec);

  udot[0] = p[0] * u[0] - p[1] * u[0] * u[1];
  udot[1] = -p[2] * u[1] + p[3] * u[0] * u[1];

  return 0;
}